

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_union_suite.cpp
# Opt level: O2

void visitor_suite::test_void_with_int(void)

{
  storage_type data;
  int local_1c;
  type local_18 [2];
  undefined8 local_10;
  
  local_10 = 0;
  local_18[0].__data[0] = '\x01';
  local_1c = 0x2a;
  trial::dynamic::detail::small_union<std::allocator<char>,int,unsigned_long,bool,int>::
  call<visitor_suite::visitor_void_with_int,void,int>
            ((small_union<std::allocator<char>,int,unsigned_long,bool,int> *)&local_18[0].__align,
             &local_1c);
  local_1c = 0x2a;
  trial::dynamic::detail::small_union<std::allocator<char>,int,unsigned_long,bool,int>::
  call<visitor_suite::const_visitor_void_with_int,void,int>
            ((small_union<std::allocator<char>,int,unsigned_long,bool,int> *)&local_18[0].__align,
             &local_1c);
  trial::dynamic::detail::small_union<std::allocator<char>,_int,_unsigned_long,_bool,_int>::
  ~small_union((small_union<std::allocator<char>,_int,_unsigned_long,_bool,_int> *)
               &local_18[0].__align);
  return;
}

Assistant:

void test_void_with_int()
{
    storage_type data{true};
    data.call<visitor_void_with_int, void>(42);
    data.call<const_visitor_void_with_int, void>(42);
}